

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# akarin_timer.cpp
# Opt level: O1

float AkarinTimer::get_delta_time(void)

{
  duration dVar1;
  long lVar2;
  
  if (get_delta_time()::start_time == '\0') {
    get_delta_time();
  }
  dVar1.__r = std::chrono::_V2::system_clock::now();
  lVar2 = dVar1.__r - (long)get_delta_time::start_time.__d.__r;
  get_delta_time::start_time.__d.__r = (duration)(duration)dVar1.__r;
  return (float)lVar2 / 1e+09;
}

Assistant:

float AkarinTimer::get_delta_time() noexcept
{
    static auto start_time = std::chrono::high_resolution_clock::now();
    auto end = std::chrono::high_resolution_clock::now();
    std::chrono::duration<float> elapsed_seconds = end - start_time;
    start_time = end;
    return elapsed_seconds.count();
}